

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  char *pcVar1;
  u16 *puVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  ushort uVar7;
  sqlite3 *db;
  Schema *pSVar8;
  Column *pCVar9;
  u8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Pgno PVar14;
  Table *pTVar15;
  Db *pDVar16;
  char *zName;
  Index *pIVar17;
  Table *pTVar18;
  Expr *pEVar19;
  size_t sVar20;
  Expr *pEVar21;
  CollSeq *pCVar22;
  void *pvVar23;
  Vdbe *p;
  u16 uVar24;
  int iVar25;
  Schema **ppSVar26;
  Index *pIVar27;
  Op *pOVar28;
  ExprList_item *pEVar29;
  ulong uVar30;
  uint uVar31;
  char *pcVar32;
  char *pcVar33;
  long lVar34;
  Index **ppIVar35;
  long in_FS_OFFSET;
  bool bVar36;
  char *zExtra;
  Token *pName;
  DbFixer sFix;
  ulong local_180;
  char *local_170;
  Index *local_168;
  ExprList *local_160;
  char *local_128;
  Token *local_120;
  Parse *local_118;
  undefined1 auStack_110 [40];
  anon_union_8_18_67db040d_for_u local_e8;
  Schema *pSStack_e0;
  undefined1 *local_d8;
  char *pcStack_d0;
  char *local_c8;
  Token *pTStack_c0;
  char *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ExprList *local_98;
  SrcList *pSStack_90;
  Expr *local_88;
  ExprList *pEStack_80;
  Expr *local_78;
  ExprList *pEStack_70;
  Select *local_68;
  Select *pSStack_60;
  Expr *local_58;
  With *pWStack_50;
  Window *local_48;
  Window *pWStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pTStack_c0 = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  pSStack_e0 = (Schema *)&DAT_aaaaaaaaaaaaaaaa;
  auStack_110._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_110._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_110._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_110._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  auStack_110._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  db = pParse->db;
  local_120 = (Token *)0x0;
  local_128 = (char *)0x0;
  if ((pParse->nErr != 0) || ((idxType != '\x02' && (pParse->eParseMode == '\x01')))) {
LAB_001656f2:
    zName = (char *)0x0;
    pIVar17 = (Index *)0x0;
    pTVar15 = (Table *)0x0;
    goto LAB_001656f8;
  }
  iVar11 = sqlite3ReadSchema(pParse);
  if ((iVar11 == 0) && (iVar11 = sqlite3HasExplicitNulls(pParse,pList), iVar11 == 0)) {
    if (pTblName == (SrcList *)0x0) {
      pTVar15 = pParse->pNewTable;
      if (pTVar15 == (Table *)0x0) goto LAB_001656f2;
      if (pTVar15->pSchema == (Schema *)0x0) {
        iVar11 = -0x8000;
LAB_001659d6:
        local_168 = (Index *)0x0;
      }
      else {
        iVar11 = -1;
        local_168 = (Index *)0x0;
        ppSVar26 = &db->aDb->pSchema;
        do {
          iVar11 = iVar11 + 1;
          pSVar8 = *ppSVar26;
          ppSVar26 = ppSVar26 + 4;
        } while (pSVar8 != pTVar15->pSchema);
      }
LAB_001659e6:
      pDVar16 = db->aDb + iVar11;
      pcVar33 = pTVar15->zName;
      iVar12 = sqlite3_strnicmp(pcVar33,"sqlite_",7);
      if (((iVar12 == 0) && (pTblName != (SrcList *)0x0)) && ((db->init).busy == '\0')) {
        pcVar32 = "table %s may not be indexed";
LAB_00165a52:
        zName = (char *)0x0;
        sqlite3ErrorMsg(pParse,pcVar32,pcVar33);
        goto LAB_00165a6f;
      }
      if (pTVar15->eTabType == '\x01') {
        pcVar33 = "virtual tables may not be indexed";
LAB_00165a62:
        zName = (char *)0x0;
        sqlite3ErrorMsg(pParse,pcVar33);
      }
      else {
        if (pTVar15->eTabType == '\x02') {
          pcVar33 = "views may not be indexed";
          goto LAB_00165a62;
        }
        if (local_120 == (Token *)0x0) {
          for (pIVar17 = pTVar15->pIndex; pIVar17 != (Index *)0x0; pIVar17 = pIVar17->pNext) {
          }
          pIVar17 = (Index *)0x0;
          zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",pcVar33);
          if (zName == (char *)0x0) goto LAB_001656f8;
          if (pParse->eParseMode != '\0') {
            zName[7] = zName[7] + '\x01';
          }
          goto LAB_00165b65;
        }
        zName = sqlite3NameFromToken(db,local_120);
        if (zName == (char *)0x0) {
          zName = (char *)0x0;
        }
        else {
          iVar12 = sqlite3CheckObjectName(pParse,zName,"index",pTVar15->zName);
          if (iVar12 == 0) {
            if (pParse->eParseMode < 2) {
              if (((db->init).busy == '\0') &&
                 (pTVar18 = sqlite3FindTable(db,zName,pDVar16->zDbSName), pTVar18 != (Table *)0x0))
              {
                pcVar33 = "there is already a table named %s";
              }
              else {
                pIVar17 = sqlite3FindIndex(db,zName,pDVar16->zDbSName);
                if (pIVar17 == (Index *)0x0) goto LAB_00165b65;
                if (ifNotExist != 0) {
                  sqlite3CodeVerifySchema(pParse,iVar11);
                  sqlite3ForceNotReadOnly(pParse);
                  goto LAB_00165a6f;
                }
                pcVar33 = "index %s already exists";
              }
              pIVar17 = (Index *)0x0;
              sqlite3ErrorMsg(pParse,pcVar33,zName);
              goto LAB_001656f8;
            }
LAB_00165b65:
            if (pParse->eParseMode < 2) {
              pcVar33 = pDVar16->zDbSName;
              pcVar32 = "sqlite_master";
              if (iVar11 == 1) {
                pcVar32 = "sqlite_temp_master";
              }
              pIVar17 = (Index *)0x0;
              iVar12 = sqlite3AuthCheck(pParse,0x12,pcVar32,(char *)0x0,pcVar33);
              if (iVar12 != 0) goto LAB_001656f8;
              iVar12 = sqlite3AuthCheck(pParse,(uint)(iVar11 == 1) * 2 + 1,zName,pTVar15->zName,
                                        pcVar33);
              if (iVar12 != 0) goto LAB_00165a6f;
            }
            if (pList == (ExprList *)0x0) {
              uStack_b0._0_4_ = 0xaaaaaaaa;
              uStack_b0._4_4_ = -0x55555556;
              pCVar9 = pTVar15->aCol;
              sVar5 = pTVar15->nCol;
              puVar2 = &pCVar9[(long)sVar5 + -1].colFlags;
              *puVar2 = *puVar2 | 8;
              local_b8 = pCVar9[(long)sVar5 + -1].zCnName;
              if (local_b8 == (char *)0x0) {
                uStack_b0._0_4_ = 0;
              }
              else {
                sVar20 = strlen(local_b8);
                uStack_b0._0_4_ = (uint)sVar20 & 0x3fffffff;
              }
              pEVar19 = sqlite3ExprAlloc(db,0x3c,(Token *)&local_b8,0);
              pList = sqlite3ExprListAppendNew(pParse->db,pEVar19);
              if (pList == (ExprList *)0x0) goto LAB_00165a6f;
              iVar12 = 0;
              if (sortOrder != -1) {
                iVar12 = sortOrder;
              }
              pList->a[(long)pList->nExpr + -1].fg.sortFlags = (u8)iVar12;
            }
            else {
              if (pParse->db->aLimit[2] < pList->nExpr) {
                sqlite3ErrorMsg(pParse,"too many columns in %s","index");
              }
              if (pParse->nErr != 0) {
                pIVar17 = (Index *)0x0;
                goto LAB_001656f8;
              }
            }
            iVar12 = pList->nExpr;
            iVar25 = 1;
            if (0 < (long)iVar12) {
              lVar34 = 0;
              iVar25 = 0;
              do {
                pcVar33 = *(char **)((long)&pList->a[0].pExpr + lVar34);
                if (*pcVar33 == 'r') {
                  pcVar33 = *(char **)(pcVar33 + 8);
                  if (pcVar33 == (char *)0x0) {
                    iVar13 = 1;
                  }
                  else {
                    sVar20 = strlen(pcVar33);
                    iVar13 = ((uint)sVar20 & 0x3fffffff) + 1;
                  }
                  iVar25 = iVar25 + iVar13;
                }
                lVar34 = lVar34 + 0x18;
              } while ((long)iVar12 * 0x18 != lVar34);
              iVar25 = iVar25 + 1;
            }
            sVar20 = strlen(zName);
            uVar31 = (uint)sVar20 & 0x3fffffff;
            uVar24 = 1;
            if (local_168 != (Index *)0x0) {
              uVar24 = local_168->nKeyCol;
            }
            pIVar17 = sqlite3AllocateIndexObject
                                (db,(short)iVar12 + uVar24,iVar25 + uVar31,&local_128);
            pcVar33 = local_128;
            if (db->mallocFailed != '\0') goto LAB_001656f8;
            pIVar17->zName = local_128;
            local_128 = local_128 + (ulong)uVar31 + 1;
            memcpy(pcVar33,zName,(ulong)uVar31 + 1);
            pIVar17->pTable = pTVar15;
            pIVar17->onError = (u8)onError;
            *(ushort *)&pIVar17->field_0x63 =
                 (ushort)(idxType & 3) + (ushort)(onError != 0) * 8 |
                 *(ushort *)&pIVar17->field_0x63 & 0xfff4;
            pIVar17->pSchema = db->aDb[iVar11].pSchema;
            pIVar17->nKeyCol = (u16)pList->nExpr;
            if (pPIWhere != (Expr *)0x0) {
              sqlite3ResolveSelfReference(pParse,pTVar15,2,pPIWhere,(ExprList *)0x0);
              pIVar17->pPartIdxWhere = pPIWhere;
            }
            bVar3 = pDVar16->pSchema->file_format;
            local_160 = pList;
            if (1 < pParse->eParseMode) {
              pIVar17->aColExpr = pList;
              local_160 = (ExprList *)0x0;
            }
            if (pIVar17->nKeyCol == 0) {
              local_180 = 0;
            }
            else {
              pEVar29 = pList->a;
              local_180 = 0;
              do {
                pEVar19 = pEVar29->pExpr;
                pEVar21 = pEVar19;
                if ((pEVar19->op == 'v') ||
                   ((pEVar19->op == 'r' && (pEVar21 = pEVar19->pLeft, pEVar21->op == 'v')))) {
                  pEVar21->op = '<';
                }
                sqlite3ResolveSelfReference(pParse,pTVar15,0x20,pEVar19,(ExprList *)0x0);
                if (pParse->nErr == 0) {
                  for (pEVar19 = pEVar29->pExpr;
                      (pEVar19 != (Expr *)0x0 && ((pEVar19->flags & 0x2000) != 0));
                      pEVar19 = pEVar19->pLeft) {
                  }
                  if (pEVar19->op == 0xa8) {
                    uVar31 = (uint)pEVar19->iColumn;
                    if (pEVar19->iColumn < 0) {
                      uVar31 = (uint)pTVar15->iPKey;
                    }
                    else {
                      if ((pTVar15->aCol[uVar31].field_0x8 & 0xf) == 0) {
                        pIVar17->field_0x63 = pIVar17->field_0x63 & 0xf7;
                      }
                      if ((pTVar15->aCol[uVar31].colFlags & 0x20) != 0) {
                        pIVar17->field_0x64 = pIVar17->field_0x64 | 0x18;
                      }
                    }
                    pIVar17->aiColumn[local_180] = (i16)uVar31;
LAB_00165fa6:
                    if (pEVar29->pExpr->op == 'r') {
                      pcVar32 = (pEVar29->pExpr->u).zToken;
                      if (pcVar32 == (char *)0x0) {
                        sVar20 = 1;
                      }
                      else {
                        sVar20 = strlen(pcVar32);
                        sVar20 = (ulong)((uint)sVar20 & 0x3fffffff) + 1;
                      }
                      pcVar33 = local_128;
                      memcpy(local_128,pcVar32,sVar20);
                      local_128 = pcVar33 + sVar20;
                    }
                    else {
                      if (-1 < (int)uVar31) {
                        uVar6 = pTVar15->aCol[uVar31].colFlags;
                        if ((uVar6 >> 9 & 1) != 0) {
                          pcVar33 = pTVar15->aCol[uVar31].zCnName + -1;
                          do {
                            pcVar32 = pcVar33 + 1;
                            pcVar33 = pcVar33 + 1;
                          } while (*pcVar32 != '\0');
                          pcVar32 = pcVar33;
                          if ((uVar6 & 4) != 0) {
                            do {
                              pcVar33 = pcVar32 + 1;
                              pcVar1 = pcVar32 + 1;
                              pcVar32 = pcVar33;
                            } while (*pcVar1 != '\0');
                          }
                          pcVar33 = pcVar33 + 1;
                          goto LAB_00166060;
                        }
                      }
                      pcVar33 = (char *)0x0;
                    }
LAB_00166060:
                    if (pcVar33 == (char *)0x0) {
                      pcVar33 = "BINARY";
                    }
                    if (((db->init).busy != '\0') ||
                       (pCVar22 = sqlite3LocateCollSeq(pParse,pcVar33), pCVar22 != (CollSeq *)0x0))
                    {
                      uVar10 = '\0';
                      pIVar17->azColl[local_180] = pcVar33;
                      if (3 < bVar3) {
                        uVar10 = (pEVar29->fg).sortFlags;
                      }
                      pIVar17->aSortOrder[local_180] = uVar10;
                      bVar36 = true;
                      goto LAB_001660c1;
                    }
                  }
                  else {
                    if (pTVar15 != pParse->pNewTable) {
                      if (pIVar17->aColExpr == (ExprList *)0x0) {
                        pIVar17->aColExpr = local_160;
                        local_160 = (ExprList *)0x0;
                      }
                      pIVar17->aiColumn[local_180] = -2;
                      *(ushort *)&pIVar17->field_0x63 =
                           *(ushort *)&pIVar17->field_0x63 & 0xeff7 | 0x1000;
                      uVar31 = 0xfffffffe;
                      goto LAB_00165fa6;
                    }
                    sqlite3ErrorMsg(pParse,
                                    "expressions prohibited in PRIMARY KEY and UNIQUE constraints");
                  }
                  bVar36 = false;
                }
                else {
                  bVar36 = false;
                }
LAB_001660c1:
                if (!bVar36) {
                  pPIWhere = (Expr *)0x0;
                  pList = local_160;
                  goto LAB_001656f8;
                }
                local_180 = local_180 + 1;
                pEVar29 = pEVar29 + 1;
              } while (local_180 < pIVar17->nKeyCol);
            }
            if (local_168 == (Index *)0x0) {
              pIVar17->aiColumn[local_180 & 0xffffffff] = -1;
              pIVar17->azColl[local_180 & 0xffffffff] = "BINARY";
            }
            else if (local_168->nKeyCol != 0) {
              uVar30 = 0;
              do {
                iVar12 = isDupColumn(pIVar17,(uint)pIVar17->nKeyCol,local_168,(int)uVar30);
                if (iVar12 == 0) {
                  iVar12 = (int)local_180;
                  pIVar17->aiColumn[iVar12] = local_168->aiColumn[uVar30];
                  pIVar17->azColl[iVar12] = local_168->azColl[uVar30];
                  pIVar17->aSortOrder[iVar12] = local_168->aSortOrder[uVar30];
                  local_180 = (ulong)(iVar12 + 1);
                }
                else {
                  pIVar17->nColumn = pIVar17->nColumn - 1;
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 < local_168->nKeyCol);
            }
            sqlite3DefaultRowEst(pIVar17);
            if (pParse->pNewTable == (Table *)0x0) {
              estimateIndexWidth(pIVar17);
            }
            recomputeColumnsNotIndexed(pIVar17);
            if ((pTblName != (SrcList *)0x0) &&
               (uVar6 = pIVar17->nColumn, (int)pTVar15->nCol <= (int)(uint)uVar6)) {
              uVar7 = *(ushort *)&pIVar17->field_0x63;
              *(ushort *)&pIVar17->field_0x63 = uVar7 | 0x20;
              if (0 < pTVar15->nCol) {
                iVar12 = 0;
                do {
                  if (iVar12 != pTVar15->iPKey) {
                    if ((ulong)uVar6 != 0) {
                      uVar30 = 0;
                      while (pIVar17->aiColumn[uVar30] != (short)iVar12) {
                        uVar30 = uVar30 + 1;
                        if (uVar6 == uVar30) goto LAB_00166253;
                      }
                      if (-1 < (short)uVar30) goto LAB_0016624b;
                    }
LAB_00166253:
                    *(ushort *)&pIVar17->field_0x63 = uVar7 & 0xffdf;
                    break;
                  }
LAB_0016624b:
                  iVar12 = iVar12 + 1;
                } while (iVar12 != pTVar15->nCol);
              }
            }
            if (pTVar15 == pParse->pNewTable) {
              pIVar27 = pTVar15->pIndex;
              if (pIVar27 != (Index *)0x0) {
LAB_00166283:
                uVar6 = pIVar27->nKeyCol;
                iVar12 = 0x14;
                if (uVar6 == pIVar17->nKeyCol) {
                  uVar30 = 0;
                  uVar31 = (uint)uVar6;
                  if (uVar31 != 0) {
                    uVar30 = 0;
LAB_001662c3:
                    if (pIVar27->aiColumn[uVar30] == pIVar17->aiColumn[uVar30]) {
                      lVar34 = 0;
                      do {
                        bVar3 = pIVar27->azColl[uVar30][lVar34];
                        bVar4 = pIVar17->azColl[uVar30][lVar34];
                        if (bVar3 == bVar4) {
                          if ((ulong)bVar3 == 0) goto LAB_0016630d;
                        }
                        else if (""[bVar3] != ""[bVar4]) goto LAB_0016630d;
                        lVar34 = lVar34 + 1;
                      } while( true );
                    }
                  }
                  goto LAB_00166331;
                }
                goto LAB_001663ba;
              }
              bVar36 = true;
              goto LAB_001663db;
            }
            goto LAB_001663e3;
          }
        }
      }
LAB_00165a6f:
      pIVar17 = (Index *)0x0;
      goto LAB_001656f8;
    }
    iVar11 = sqlite3TwoPartName(pParse,pName1,pName2,&local_120);
    if (-1 < iVar11) {
      if ((((db->init).busy == '\0') &&
          (pTVar15 = sqlite3SrcListLookup(pParse,pTblName),
          pTVar15 != (Table *)0x0 && pName2->n == 0)) && (pTVar15->pSchema == db->aDb[1].pSchema)) {
        iVar11 = 1;
      }
      pDVar16 = pParse->db->aDb;
      pcStack_d0 = pDVar16[iVar11].zDbSName;
      pSStack_e0 = pDVar16[iVar11].pSchema;
      local_c8 = "index";
      pTStack_c0 = local_120;
      local_d8 = (undefined1 *)CONCAT71(local_d8._1_7_,iVar11 == 1);
      auStack_110._8_8_ = fixExprCb;
      auStack_110._16_8_ = fixSelectCb;
      auStack_110._24_8_ = sqlite3WalkWinDefnDummyCallback;
      auStack_110._32_8_ = auStack_110._32_8_ & 0xffff000000000000;
      local_e8.pNC = (NameContext *)&local_118;
      local_98 = (ExprList *)0x0;
      local_b8 = (char *)0x0;
      uStack_b0._0_4_ = 0;
      uStack_b0._4_4_ = 0;
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      uStack_a0._0_4_ = 0;
      uStack_a0._4_4_ = 0;
      local_88 = (Expr *)0x0;
      pEStack_80 = (ExprList *)0x0;
      local_78 = (Expr *)0x0;
      pEStack_70 = (ExprList *)0x0;
      local_68 = (Select *)0x0;
      pSStack_60 = (Select *)0x0;
      local_58 = (Expr *)0x0;
      pWStack_50 = (With *)0x0;
      local_48 = (Window *)0x0;
      pWStack_40 = (Window *)0x0;
      local_118 = pParse;
      auStack_110._0_8_ = pParse;
      pSStack_90 = pTblName;
      sqlite3WalkSelect((Walker *)auStack_110,(Select *)&local_b8);
      pTVar15 = sqlite3LocateTableItem(pParse,0,pTblName->a);
      if (pTVar15 != (Table *)0x0) {
        if ((iVar11 != 1) || (db->aDb[1].pSchema == pTVar15->pSchema)) {
          if ((pTVar15->tabFlags & 0x80) == 0) goto LAB_001659d6;
          for (local_168 = pTVar15->pIndex;
              (local_168 != (Index *)0x0 && ((*(ushort *)&local_168->field_0x63 & 3) != 2));
              local_168 = local_168->pNext) {
          }
          goto LAB_001659e6;
        }
        pcVar33 = pTVar15->zName;
        pcVar32 = "cannot create a TEMP index on non-TEMP table \"%s\"";
        goto LAB_00165a52;
      }
    }
  }
  zName = (char *)0x0;
  pIVar17 = (Index *)0x0;
  pTVar15 = (Table *)0x0;
LAB_001656f8:
  if (pIVar17 != (Index *)0x0) {
    sqlite3FreeIndex(db,pIVar17);
  }
  if ((pTVar15 != (Table *)0x0) && (pIVar17 = pTVar15->pIndex, pIVar17 != (Index *)0x0)) {
    if (pIVar17->onError == '\x05') {
      ppIVar35 = &pTVar15->pIndex;
    }
    else {
      do {
        pIVar27 = pIVar17;
        pIVar17 = pIVar27->pNext;
        if (pIVar17 == (Index *)0x0) goto LAB_00165762;
      } while (pIVar17->onError != '\x05');
      ppIVar35 = &pIVar27->pNext;
    }
    while ((pIVar27 = pIVar17->pNext, pIVar27 != (Index *)0x0 && (pIVar27->onError != '\x05'))) {
      *ppIVar35 = pIVar27;
      ppIVar35 = &pIVar27->pNext;
      pIVar17->pNext = pIVar27->pNext;
      pIVar27->pNext = pIVar17;
    }
  }
LAB_00165762:
  if (pPIWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pPIWhere);
  }
  if (pList != (ExprList *)0x0) {
    exprListDeleteNN(db,pList);
  }
  sqlite3SrcListDelete(db,pTblName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_0016630d:
  if (bVar3 != bVar4) goto LAB_00166331;
  uVar30 = uVar30 + 1;
  if (uVar30 == uVar31) goto code_r0x0016631e;
  goto LAB_001662c3;
code_r0x0016631e:
  uVar30 = (ulong)uVar31;
LAB_00166331:
  iVar12 = 0;
  if ((uint)uVar30 == (uint)uVar6) {
    if (pIVar27->onError != pIVar17->onError) {
      if ((pIVar27->onError != '\v') && (pIVar17->onError != '\v')) {
        sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
      }
      if (pIVar27->onError == '\v') {
        pIVar27->onError = pIVar17->onError;
      }
    }
    if (idxType == '\x02') {
      *(ushort *)&pIVar27->field_0x63 = *(ushort *)&pIVar27->field_0x63 & 0xfffc | 2;
    }
    iVar12 = 2;
    if (1 < pParse->eParseMode) {
      pIVar17->pNext = pParse->pNewIndex;
      pParse->pNewIndex = pIVar17;
      pIVar17 = (Index *)0x0;
    }
  }
LAB_001663ba:
  if ((iVar12 != 0x14) && (iVar12 != 0)) goto LAB_001663d2;
  pIVar27 = pIVar27->pNext;
  if (pIVar27 == (Index *)0x0) goto code_r0x001663d0;
  goto LAB_00166283;
code_r0x001663d0:
  iVar12 = 0;
LAB_001663d2:
  bVar36 = iVar12 == 0;
LAB_001663db:
  if (bVar36) {
LAB_001663e3:
    if (pParse->eParseMode < 2) {
      if ((db->init).busy == '\0') {
        if ((pTblName != (SrcList *)0x0) || ((pTVar15->tabFlags & 0x80) == 0)) {
          iVar12 = pParse->nMem + 1;
          pParse->nMem = iVar12;
          p = sqlite3GetVdbe(pParse);
          if (p == (Vdbe *)0x0) goto LAB_0016648f;
          sqlite3BeginWriteOperation(pParse,1,iVar11);
          local_170 = (char *)0x0;
          PVar14 = sqlite3VdbeAddOp3(p,0xbb,0,0,0);
          pIVar17->tnum = PVar14;
          sqlite3VdbeAddOp3(p,0x93,iVar11,iVar12,2);
          if (pStart != (Token *)0x0) {
            iVar25 = (*(int *)&(pParse->sLastToken).z - (int)local_120->z) + (pParse->sLastToken).n;
            pcVar33 = " UNIQUE";
            if (onError == 0) {
              pcVar33 = "";
            }
            local_170 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar33,
                                       (ulong)(iVar25 - (uint)(local_120->z[(long)iVar25 + -1] ==
                                                              ';')));
          }
          sqlite3NestedParse(pParse,"INSERT INTO %Q.sqlite_master VALUES(\'index\',%Q,%Q,#%d,%Q);",
                             db->aDb[iVar11].zDbSName,pIVar17->zName,pTVar15->zName,iVar12,local_170
                            );
          if (local_170 != (char *)0x0) {
            sqlite3DbFreeNN(db,local_170);
          }
          if (pTblName != (SrcList *)0x0) {
            sqlite3RefillIndex(pParse,pIVar17,iVar12);
            sqlite3ChangeCookie(pParse,iVar11);
            pcVar33 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar17->zName);
            sqlite3VdbeAddParseSchemaOp(p,iVar11,pcVar33,0);
            sqlite3VdbeAddOp3(p,0xa6,0,1,0);
          }
          if (p->db->mallocFailed == '\0') {
            pOVar28 = p->aOp + (int)pIVar17->tnum;
          }
          else {
            pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar28->p2 = p->nOp;
        }
      }
      else {
        if (pTblName != (SrcList *)0x0) {
          PVar14 = (db->init).newTnum;
          pIVar17->tnum = PVar14;
          for (pIVar27 = pIVar17->pTable->pIndex; pIVar27 != (Index *)0x0; pIVar27 = pIVar27->pNext)
          {
            if ((pIVar27 != pIVar17) && (pIVar27->tnum == PVar14)) {
              sqlite3ErrorMsg(pParse,"invalid rootpage");
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1ee1f);
              pParse->rc = 0xb;
              goto LAB_0016648f;
            }
          }
        }
        pvVar23 = sqlite3HashInsert(&pIVar17->pSchema->idxHash,pIVar17->zName,pIVar17);
        if (pvVar23 != (void *)0x0) {
          sqlite3OomFault(db);
          goto LAB_0016648f;
        }
        *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
      }
    }
    if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
      pIVar17->pNext = pTVar15->pIndex;
      pTVar15->pIndex = pIVar17;
    }
    else {
      if (pParse->eParseMode < 2) goto LAB_0016648f;
      pParse->pNewIndex = pIVar17;
    }
    pIVar17 = (Index *)0x0;
  }
LAB_0016648f:
  pPIWhere = (Expr *)0x0;
  pList = local_160;
  goto LAB_001656f8;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto exit_create_index;
  }
  assert( db->mallocFailed==0 );
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }
  if( sqlite3HasExplicitNulls(pParse, pList) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initializing a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse,
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0
       && db->init.busy==0
       && pTblName!=0
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_schema table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName,"index",pTab->zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, pDb->zDbSName)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
          sqlite3ForceNotReadOnly(pParse);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder, SQLITE_SO_UNDEFINED);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /*
  ** Allocate the index structure.
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
      pIndex->bHasExpr = 1;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else{
        if( pTab->aCol[j].notNull==0 ){
          pIndex->uniqNotNull = 0;
        }
        if( pTab->aCol[j].colFlags & COLFLAG_VIRTUAL ){
          pIndex->bHasVCol = 1;
          pIndex->bHasExpr = 1;
        }
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      assert( !ExprHasProperty(pListItem->pExpr, EP_IntValue) );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = sqlite3ColumnColl(&pTab->aCol[j]);
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->fg.sortFlags & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( isDupColumn(pIndex, pIndex->nKeyCol, pPk, j) ){
        pIndex->nColumn--;
      }else{
        testcase( hasColumn(pIndex->aiColumn,pIndex->nKeyCol,x) );
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab)
      || pTab->iPKey<0 || sqlite3TableColumnToIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3TableColumnToIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse,
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures.
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash,
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_schema table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_schema
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in
      ** Index.tnum. This is required in case this index is actually a
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = (Pgno)sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      assert( pName!=0 || pStart==0 );
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_schema for this index
      */
      sqlite3NestedParse(pParse,
         "INSERT INTO %Q." LEGACY_SCHEMA_TABLE " VALUES('index',%Q,%Q,#%d,%Q);",
         db->aDb[iDb].zDbSName,
         pIndex->zName,
         pTab->zName,
         iMem,
         zStmt
      );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName), 0);
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, (int)pIndex->tnum);
    }
  }
  if( db->init.busy || pTblName==0 ){
    pIndex->pNext = pTab->pIndex;
    pTab->pIndex = pIndex;
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  if( pTab ){
    /* Ensure all REPLACE indexes on pTab are at the end of the pIndex list.
    ** The list was already ordered when this routine was entered, so at this
    ** point at most a single index (the newly added index) will be out of
    ** order.  So we have to reorder at most one index. */
    Index **ppFrom;
    Index *pThis;
    for(ppFrom=&pTab->pIndex; (pThis = *ppFrom)!=0; ppFrom=&pThis->pNext){
      Index *pNext;
      if( pThis->onError!=OE_Replace ) continue;
      while( (pNext = pThis->pNext)!=0 && pNext->onError!=OE_Replace ){
        *ppFrom = pNext;
        pThis->pNext = pNext->pNext;
        pNext->pNext = pThis;
        ppFrom = &pNext->pNext;
      }
      break;
    }
#ifdef SQLITE_DEBUG
    /* Verify that all REPLACE indexes really are now at the end
    ** of the index list.  In other words, no other index type ever
    ** comes after a REPLACE index on the list. */
    for(pThis = pTab->pIndex; pThis; pThis=pThis->pNext){
      assert( pThis->onError!=OE_Replace
           || pThis->pNext==0
           || pThis->pNext->onError==OE_Replace );
    }
#endif
  }
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}